

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<pbrt::Token> * __thiscall
pbrt::Tokenizer::Next(optional<pbrt::Token> *__return_storage_ptr__,Tokenizer *this)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  anon_struct_8_0_00000001_for___align aVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  char *pcVar9;
  FileLoc startLoc;
  char *va;
  char *vb;
  
  do {
    startLoc.line = (this->loc).line;
    startLoc.column = (this->loc).column;
    pcVar9 = this->pos;
    startLoc.filename._M_len = (this->loc).filename._M_len;
    startLoc.filename._M_str = (this->loc).filename._M_str;
    uVar5 = getChar(this);
    if (0x23 < uVar5) goto LAB_003f22ea;
    uVar7 = (ulong)uVar5;
  } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
  if (uVar7 == 0x22) {
    bVar8 = false;
    do {
      iVar6 = getChar(this);
      if (iVar6 == 0x5c) {
        iVar6 = getChar(this);
        bVar8 = true;
      }
      else {
        if (iVar6 == 10) {
          pcVar9 = "unterminated string";
          goto LAB_003f23cb;
        }
        if (iVar6 == 0x22) {
          if (bVar8) {
            (this->sEscaped)._M_string_length = 0;
            *(this->sEscaped)._M_dataplus._M_p = '\0';
            do {
              pcVar2 = this->pos;
              if (pcVar2 <= pcVar9) {
                pcVar3 = (this->sEscaped)._M_dataplus._M_p;
                aVar4 = (anon_struct_8_0_00000001_for___align)(this->sEscaped)._M_string_length;
                *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
                     startLoc._16_8_;
                *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
                     startLoc.filename._M_len;
                *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) =
                     startLoc.filename._M_str;
                __return_storage_ptr__->set = true;
                (__return_storage_ptr__->optionalValue).__align = aVar4;
                *(pointer *)((long)&__return_storage_ptr__->optionalValue + 8) = pcVar3;
                return __return_storage_ptr__;
              }
              if (*pcVar9 == '\\') {
                pcVar9 = pcVar9 + 1;
                vb = pcVar2;
                if (pcVar2 <= pcVar9) {
                  va = pcVar9;
                  LogFatal<char_const(&)[2],char_const(&)[4],char_const(&)[2],char_const*&,char_const(&)[4],char_const*&>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp"
                             ,0x11a,"Check failed: %s < %s with %s = %s, %s = %s",
                             (char (*) [2])0xa49999,(char (*) [4])"pos",(char (*) [2])0xa49999,&va,
                             (char (*) [4])"pos",&vb);
                }
                cVar1 = *pcVar9;
                va = (char *)CONCAT44((int)((ulong)pcVar9 >> 0x20),(int)cVar1);
                if (((((cVar1 != '\"') && (cVar1 != '\'')) && (cVar1 != '\\')) &&
                    ((cVar1 != 'b' && (cVar1 != 'f')))) &&
                   ((cVar1 != 'n' && ((cVar1 != 'r' && (cVar1 != 't')))))) {
                  if (cVar1 == -1) {
                    ErrorExit(&startLoc,"premature EOF after character escape \'\\\'");
                  }
                  ErrorExit<int&>(&startLoc,"unexpected escaped character \"%c\"",(int *)&va);
                }
              }
              std::__cxx11::string::push_back((char)this + 'x');
              pcVar9 = pcVar9 + 1;
            } while( true );
          }
          goto LAB_003f238c;
        }
      }
    } while (iVar6 != -1);
    pcVar9 = "premature EOF";
LAB_003f23cb:
    std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
              (&this->errorCallback,pcVar9,&startLoc);
LAB_003f23d6:
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  }
  else {
    if (uVar7 == 0x23) {
      do {
        iVar6 = getChar(this);
        if (iVar6 == -1) goto LAB_003f238c;
      } while ((iVar6 != 0xd) && (iVar6 != 10));
LAB_003f2384:
      ungetChar(this);
LAB_003f238c:
      pcVar2 = this->pos;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = startLoc._16_8_;
      *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = startLoc.filename._M_len;
      *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = startLoc.filename._M_str;
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align =
           (anon_struct_8_0_00000001_for___align)((long)pcVar2 - (long)pcVar9);
    }
    else {
LAB_003f22ea:
      if (uVar5 == 0xffffffff) goto LAB_003f23d6;
      if ((uVar5 != 0x5b) && (uVar5 != 0x5d)) {
        do {
          iVar6 = getChar(this);
          uVar5 = iVar6 + 1;
          if (uVar5 < 0x24) {
            if ((0xa00004c00U >> ((ulong)uVar5 & 0x3f) & 1) != 0) goto LAB_003f2384;
            if ((ulong)uVar5 == 0) goto LAB_003f238c;
          }
          if ((iVar6 == 0x5d) || (iVar6 == 0x5b)) goto LAB_003f2384;
        } while( true );
      }
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = startLoc._16_8_;
      *(size_t *)((long)&__return_storage_ptr__->optionalValue + 0x10) = startLoc.filename._M_len;
      *(char **)((long)&__return_storage_ptr__->optionalValue + 0x18) = startLoc.filename._M_str;
      __return_storage_ptr__->set = true;
      (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x1;
    }
    *(char **)((long)&__return_storage_ptr__->optionalValue + 8) = pcVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<Token> Tokenizer::Next() {
    while (true) {
        const char *tokenStart = pos;
        FileLoc startLoc = loc;

        int ch = getChar();
        if (ch == EOF)
            return {};
        else if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r') {
            // nothing
        } else if (ch == '"') {
            // scan to closing quote
            bool haveEscaped = false;
            while ((ch = getChar()) != '"') {
                if (ch == EOF) {
                    errorCallback("premature EOF", &startLoc);
                    return {};
                } else if (ch == '\n') {
                    errorCallback("unterminated string", &startLoc);
                    return {};
                } else if (ch == '\\') {
                    haveEscaped = true;
                    // Grab the next character
                    if ((ch = getChar()) == EOF) {
                        errorCallback("premature EOF", &startLoc);
                        return {};
                    }
                }
            }

            if (!haveEscaped)
                return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
            else {
                sEscaped.clear();
                for (const char *p = tokenStart; p < pos; ++p) {
                    if (*p != '\\')
                        sEscaped.push_back(*p);
                    else {
                        ++p;
                        CHECK_LT(p, pos);
                        sEscaped.push_back(decodeEscaped(*p, startLoc));
                    }
                }
                return Token({sEscaped.data(), sEscaped.size()}, startLoc);
            }
        } else if (ch == '[' || ch == ']') {
            return Token({tokenStart, size_t(1)}, startLoc);
        } else if (ch == '#') {
            // comment: scan to EOL (or EOF)
            while ((ch = getChar()) != EOF) {
                if (ch == '\n' || ch == '\r') {
                    ungetChar();
                    break;
                }
            }

            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        } else {
            // Regular statement or numeric token; scan until we hit a
            // space, opening quote, or bracket.
            while ((ch = getChar()) != EOF) {
                if (ch == ' ' || ch == '\n' || ch == '\t' || ch == '\r' || ch == '"' ||
                    ch == '[' || ch == ']') {
                    ungetChar();
                    break;
                }
            }
            return Token({tokenStart, size_t(pos - tokenStart)}, startLoc);
        }
    }
}